

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

MockNamedValue * __thiscall MockSupport::retrieveDataFromStore(MockSupport *this,SimpleString *name)

{
  MockNamedValue *local_20;
  MockNamedValue *newData;
  SimpleString *name_local;
  MockSupport *this_local;
  
  local_20 = MockNamedValueList::getValueByName(&this->data_,name);
  if (local_20 == (MockNamedValue *)0x0) {
    local_20 = (MockNamedValue *)
               operator_new(0x50,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport.cpp"
                            ,0x167);
    MockNamedValue::MockNamedValue(local_20,name);
    MockNamedValueList::add(&this->data_,local_20);
  }
  return local_20;
}

Assistant:

MockNamedValue* MockSupport::retrieveDataFromStore(const SimpleString& name)
{
    MockNamedValue* newData = data_.getValueByName(name);
    if (newData == NULLPTR) {
        newData = new MockNamedValue(name);
        data_.add(newData);
    }
    return newData;
}